

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayoutInfo::findSeparator
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QPoint *_pos)

{
  QDockAreaLayoutItem *this_00;
  int iVar1;
  QDockAreaLayoutItem *pQVar2;
  QDockAreaLayoutInfo *this_01;
  Representation RVar3;
  Data *pDVar4;
  int *piVar5;
  qsizetype qVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  QPoint *pQVar10;
  Representation RVar11;
  long lVar12;
  Representation RVar13;
  int t;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 local_68 [12];
  Representation RStack_5c;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_003ca8ba:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar10 = (QPoint *)&_pos->yp;
    if (this->o == Horizontal) {
      pQVar10 = _pos;
    }
    iVar1 = (pQVar10->xp).m_i;
    lVar12 = 0;
    for (uVar14 = 0; uVar14 < (ulong)(this->item_list).d.size; uVar14 = uVar14 + 1) {
      pQVar2 = (this->item_list).d.ptr;
      this_00 = (QDockAreaLayoutItem *)((long)&pQVar2->widgetItem + lVar12);
      bVar7 = QDockAreaLayoutItem::skip(this_00);
      if ((!bVar7) && ((*(byte *)((long)&pQVar2->flags + lVar12) & 1) == 0)) {
        t = (int)uVar14;
        if ((iVar1 < *(int *)((long)&pQVar2->size + lVar12) + *(int *)((long)&pQVar2->pos + lVar12))
           && (this_01 = *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar12),
              this_01 != (QDockAreaLayoutInfo *)0x0)) {
          local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
          findSeparator((QList<int> *)&local_58,this_01,_pos);
          if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (int *)0x0;
            (__return_storage_ptr__->d).size = 0;
          }
          else {
            QList<int>::prepend((QList<int> *)&local_58,t);
            qVar6 = local_58.size;
            piVar5 = local_58.ptr;
            pDVar4 = local_58.d;
            local_58.d = (Data *)0x0;
            local_58.ptr = (int *)0x0;
            (__return_storage_ptr__->d).d = pDVar4;
            (__return_storage_ptr__->d).ptr = piVar5;
            local_58.size = 0;
            (__return_storage_ptr__->d).size = qVar6;
          }
LAB_003ca8ab:
          QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
          goto LAB_003ca7d0;
        }
        iVar9 = next(this,t);
        if ((iVar9 != -1) && (((this->item_list).d.ptr[iVar9].flags & 1) == 0)) {
          stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
          local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          _local_68 = separatorRect(this,t);
          RVar3 = local_68._0_4_;
          RVar11 = local_68._8_4_;
          RVar13 = local_68._12_4_;
          if ((local_68._4_4_.m_i + -1 != RVar13.m_i || RVar3.m_i + -1 != RVar11.m_i) &&
             (*this->sep == 1)) {
            local_68._4_4_ = local_68._4_4_.m_i + -2;
            local_68._0_4_ = RVar3.m_i + -2;
            local_68._8_4_ = RVar11.m_i + 2;
            RStack_5c.m_i = RVar13.m_i + 2;
          }
          cVar8 = QRect::contains((QPoint *)local_68,SUB81(_pos,0));
          if ((cVar8 != '\0') &&
             (bVar7 = QDockAreaLayoutItem::hasFixedSize(this_00,this->o), !bVar7)) {
            local_58.d = (Data *)0x0;
            local_58.ptr = (int *)0x0;
            local_58.size = 0;
            QList<int>::append((QList<int> *)&local_58,t);
            (__return_storage_ptr__->d).d = local_58.d;
            (__return_storage_ptr__->d).ptr = local_58.ptr;
            (__return_storage_ptr__->d).size = local_58.size;
            if (local_58.d != (Data *)0x0) {
              LOCK();
              ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            goto LAB_003ca8ab;
          }
        }
      }
      lVar12 = lVar12 + 0x28;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
LAB_003ca7d0:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003ca8ba;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QDockAreaLayoutInfo::findSeparator(const QPoint &_pos) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QList<int>();
#endif

    int pos = pick(o, _pos);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip() || (item.flags & QDockAreaLayoutItem::GapItem))
            continue;

        if (item.pos + item.size > pos) {
            if (item.subinfo != nullptr) {
                QList<int> result = item.subinfo->findSeparator(_pos);
                if (!result.isEmpty()) {
                    result.prepend(i);
                    return result;
                } else {
                    return QList<int>();
                }
            }
        }

        int next = this->next(i);
        if (next == -1 || (item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            continue;

        QRect sepRect = separatorRect(i);
        if (!sepRect.isNull() && *sep == 1)
            sepRect.adjust(-2, -2, 2, 2);
        //we also make sure we don't find a separator that's not there
        if (sepRect.contains(_pos) && !item.hasFixedSize(o)) {
            return QList<int>() << i;
        }

    }

    return QList<int>();
}